

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlenderScene.cpp
# Opt level: O1

void __thiscall
Assimp::Blender::Structure::Convert<Assimp::Blender::Image>
          (Structure *this,Image *dest,FileDatabase *db)

{
  ReadField<2,Assimp::Blender::ID>(this,&dest->id,"id",db);
  ReadFieldArray<1,char,240ul>(this,&dest->name,"name",db);
  ReadField<1,short>(this,&dest->ok,"ok",db);
  ReadField<1,short>(this,&dest->flag,"flag",db);
  ReadField<1,short>(this,&dest->source,"source",db);
  ReadField<1,short>(this,&dest->type,"type",db);
  ReadField<1,short>(this,&dest->pad,"pad",db);
  ReadField<1,short>(this,&dest->pad1,"pad1",db);
  ReadField<1,int>(this,&dest->lastframe,"lastframe",db);
  ReadField<1,short>(this,&dest->tpageflag,"tpageflag",db);
  ReadField<1,short>(this,&dest->totbind,"totbind",db);
  ReadField<1,short>(this,&dest->xrep,"xrep",db);
  ReadField<1,short>(this,&dest->yrep,"yrep",db);
  ReadField<1,short>(this,&dest->twsta,"twsta",db);
  ReadField<1,short>(this,&dest->twend,"twend",db);
  ReadFieldPtr<1,std::shared_ptr,Assimp::Blender::PackedFile>
            (this,&dest->packedfile,"*packedfile",db,false);
  ReadField<1,float>(this,&dest->lastupdate,"lastupdate",db);
  ReadField<1,int>(this,&dest->lastused,"lastused",db);
  ReadField<1,short>(this,&dest->animspeed,"animspeed",db);
  ReadField<1,short>(this,&dest->gen_x,"gen_x",db);
  ReadField<1,short>(this,&dest->gen_y,"gen_y",db);
  ReadField<1,short>(this,&dest->gen_type,"gen_type",db);
  StreamReader<true,_true>::IncPtr
            ((db->reader).
             super___shared_ptr<Assimp::StreamReader<true,_true>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             ,this->size);
  return;
}

Assistant:

void Structure :: Convert<Image> (
    Image& dest,
    const FileDatabase& db
    ) const
{

    ReadField<ErrorPolicy_Fail>(dest.id,"id",db);
    ReadFieldArray<ErrorPolicy_Warn>(dest.name,"name",db);
    ReadField<ErrorPolicy_Igno>(dest.ok,"ok",db);
    ReadField<ErrorPolicy_Igno>(dest.flag,"flag",db);
    ReadField<ErrorPolicy_Igno>(dest.source,"source",db);
    ReadField<ErrorPolicy_Igno>(dest.type,"type",db);
    ReadField<ErrorPolicy_Igno>(dest.pad,"pad",db);
    ReadField<ErrorPolicy_Igno>(dest.pad1,"pad1",db);
    ReadField<ErrorPolicy_Igno>(dest.lastframe,"lastframe",db);
    ReadField<ErrorPolicy_Igno>(dest.tpageflag,"tpageflag",db);
    ReadField<ErrorPolicy_Igno>(dest.totbind,"totbind",db);
    ReadField<ErrorPolicy_Igno>(dest.xrep,"xrep",db);
    ReadField<ErrorPolicy_Igno>(dest.yrep,"yrep",db);
    ReadField<ErrorPolicy_Igno>(dest.twsta,"twsta",db);
    ReadField<ErrorPolicy_Igno>(dest.twend,"twend",db);
    ReadFieldPtr<ErrorPolicy_Igno>(dest.packedfile,"*packedfile",db);
    ReadField<ErrorPolicy_Igno>(dest.lastupdate,"lastupdate",db);
    ReadField<ErrorPolicy_Igno>(dest.lastused,"lastused",db);
    ReadField<ErrorPolicy_Igno>(dest.animspeed,"animspeed",db);
    ReadField<ErrorPolicy_Igno>(dest.gen_x,"gen_x",db);
    ReadField<ErrorPolicy_Igno>(dest.gen_y,"gen_y",db);
    ReadField<ErrorPolicy_Igno>(dest.gen_type,"gen_type",db);

    db.reader->IncPtr(size);
}